

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

void str_split(char *str,char *left,char *right,char c)

{
  char *pcVar1;
  char *p;
  char c_local;
  char *right_local;
  char *left_local;
  char *str_local;
  
  pcVar1 = strchr(str,(int)c);
  if (pcVar1 == (char *)0x0) {
    strcpy(left,str);
  }
  else {
    strncpy(left,str,(long)pcVar1 - (long)str);
    strcpy(right,pcVar1 + 1);
  }
  return;
}

Assistant:

void str_split(const char *str, char *left, char *right, char c) {
  char *p = strchr(str, c);
  if (p == NULL) {
    strcpy(left, str);
  } else {
    strncpy(left, str, p - str);
    strcpy(right, p + 1);
  }
}